

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O0

RealType __thiscall OpenMD::Thermo::getPressure(Thermo *this)

{
  SnapshotManager *this_00;
  double *pdVar1;
  undefined8 *in_RDI;
  double dVar2;
  RealType RVar3;
  RealType pressure;
  Mat3x3d tensor;
  Snapshot *snap;
  Thermo *in_stack_00000268;
  SquareMatrix3<double> *in_stack_ffffffffffffff18;
  SquareMatrix3<double> *in_stack_ffffffffffffff20;
  RectMatrix<double,_3U,_3U> local_58;
  Snapshot *local_10;
  
  this_00 = SimInfo::getSnapshotManager((SimInfo *)*in_RDI);
  local_10 = SnapshotManager::getCurrentSnapshot(this_00);
  if ((local_10->hasPressure & 1U) == 0) {
    SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x161c36);
    getPressureTensor(in_stack_00000268);
    SquareMatrix3<double>::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x161c65);
    pdVar1 = RectMatrix<double,_3U,_3U>::operator()(&local_58,0,0);
    dVar2 = *pdVar1;
    pdVar1 = RectMatrix<double,_3U,_3U>::operator()(&local_58,1,1);
    dVar2 = dVar2 + *pdVar1;
    pdVar1 = RectMatrix<double,_3U,_3U>::operator()(&local_58,2,2);
    Snapshot::setPressure(local_10,((dVar2 + *pdVar1) * 163882576.0) / 3.0);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x161d32);
  }
  RVar3 = Snapshot::getPressure(local_10);
  return RVar3;
}

Assistant:

RealType Thermo::getPressure() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasPressure) {
      // Relies on the calculation of the full molecular pressure tensor

      Mat3x3d tensor;
      RealType pressure;

      tensor = getPressureTensor();

      pressure = Constants::pressureConvert *
                 (tensor(0, 0) + tensor(1, 1) + tensor(2, 2)) / 3.0;

      snap->setPressure(pressure);
    }

    return snap->getPressure();
  }